

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void msd_A_lsd_adaptive4(uchar **strings,size_t N)

{
  Cacheblock<4U> *cache;
  uchar **ppuVar1;
  size_t sVar2;
  
  cache = (Cacheblock<4U> *)malloc(N << 4);
  if (N == 0) {
    fill_cache<4u>(cache,0,0);
    msd_lsd_adaptive<4u>(cache,0,0);
  }
  else {
    ppuVar1 = &cache->ptr;
    sVar2 = 0;
    do {
      *ppuVar1 = strings[sVar2];
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
    sVar2 = 0;
    fill_cache<4u>(cache,N,0);
    msd_lsd_adaptive<4u>(cache,N,0);
    ppuVar1 = &cache->ptr;
    do {
      strings[sVar2] = *ppuVar1;
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
  }
  free(cache);
  return;
}

Assistant:

void msd_A_lsd_adaptive4(unsigned char** strings, size_t N)
{ msd_A_lsd_adaptive<4>(strings, N); }